

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

int __thiscall Fl_Menu_::copy(Fl_Menu_ *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  int iVar2;
  Fl_Menu_Item *__dest;
  undefined8 extraout_RAX;
  ulong uVar3;
  void **ppvVar4;
  
  iVar2 = Fl_Menu_Item::size((Fl_Menu_Item *)dst);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x38),8) == 0) {
    uVar3 = SUB168(auVar1 * ZEXT816(0x38),0);
  }
  __dest = (Fl_Menu_Item *)operator_new__(uVar3);
  memcpy(__dest,dst,(long)iVar2 * 0x38);
  clear(this);
  this->menu_ = __dest;
  this->value_ = __dest;
  this->alloc = '\x01';
  if (iVar2 != 0 && src != (EVP_PKEY_CTX *)0x0) {
    ppvVar4 = &__dest->user_data_;
    do {
      if ((Fl_Callback *)ppvVar4[-1] != (Fl_Callback *)0x0) {
        *ppvVar4 = src;
      }
      iVar2 = iVar2 + -1;
      ppvVar4 = ppvVar4 + 7;
    } while (iVar2 != 0);
  }
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),src == (EVP_PKEY_CTX *)0x0);
}

Assistant:

void Fl_Menu_::copy(const Fl_Menu_Item* m, void* ud) {
  int n = m->size();
  Fl_Menu_Item* newMenu = new Fl_Menu_Item[n];
  memcpy(newMenu, m, n*sizeof(Fl_Menu_Item));
  menu(newMenu);
  alloc = 1; // make destructor free array, but not strings
  // for convenience, provide way to change all the user data pointers:
  if (ud) for (; n--;) {
    if (newMenu->callback_) newMenu->user_data_ = ud;
    newMenu++;
  }
}